

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosCorrectness>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosCorrectness> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = checkForErrorMS(imageMSInfo,dataPerSample,0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Varying values are not sampled at gl_SamplePosition",&local_39);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_38);
  }
  else {
    bVar1 = checkForErrorRS(imageRSInfo,dataRS,0);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Varying values are not sampled at gl_SamplePosition",&local_39
                );
      tcu::TestStatus::fail(__return_storage_ptr__,&local_38);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Passed",&local_39);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_38);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSamplePosCorrectness>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	if (checkForErrorMS(imageMSInfo, dataPerSample, 0))
		return tcu::TestStatus::fail("Varying values are not sampled at gl_SamplePosition");

	if (checkForErrorRS(imageRSInfo, dataRS, 0))
		return tcu::TestStatus::fail("Varying values are not sampled at gl_SamplePosition");

	return tcu::TestStatus::pass("Passed");
}